

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall
QString::replace(QString *this,qsizetype pos,qsizetype len,QChar *after,qsizetype alen)

{
  long lVar1;
  QStringView after_00;
  ulong uVar2;
  qsizetype qVar3;
  QChar *in_RDX;
  ulong in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000050;
  undefined1 in_stack_00000058 [16];
  size_t index;
  unsigned_long *in_stack_ffffffffffffff78;
  QSpan<unsigned_long,_18446744073709551615UL> *in_stack_ffffffffffffff80;
  QChar *str;
  QChar *local_50;
  QStringView *blen;
  QString *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  blen = in_RDI;
  uVar2 = size((QString *)in_RDI);
  if (in_RSI <= uVar2) {
    str = in_RDX;
    qVar3 = size((QString *)in_RDI);
    local_50 = in_RDX;
    if ((long)(qVar3 - in_RSI) < (long)str) {
      qVar3 = size((QString *)in_RDI);
      local_50 = (QChar *)(qVar3 - in_RSI);
    }
    QSpan<unsigned_long,_18446744073709551615UL>::QSpanBase
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0x1d5712);
    QStringView::QStringView<QChar,_true>(in_RDI,str,(qsizetype)local_50);
    after_00.m_size = in_stack_00000050;
    after_00.m_data = (storage_type_conflict *)this;
    replace_helper(in_stack_ffffffffffffffc8,
                   (QSpan<unsigned_long,_18446744073709551615UL>)in_stack_00000058,(qsizetype)blen,
                   after_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString &QString::replace(qsizetype pos, qsizetype len, const QChar *after, qsizetype alen)
{
    if (size_t(pos) > size_t(this->size()))
        return *this;
    if (len > this->size() - pos)
        len = this->size() - pos;

    size_t index = pos;
    replace_helper(*this, QSpan(&index, 1), len, QStringView{after, alen});
    return *this;
}